

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

ProgramResourceUsage *
deqp::gles31::Functional::getCombinedProgramResourceUsage
          (ProgramResourceUsage *__return_storage_ptr__,Program *program)

{
  Shader *pSVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar11;
  mapped_type_conflict *pmVar12;
  int *piVar13;
  _Rb_tree_node_base *p_Var14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  _Base_ptr p_Var16;
  long lVar17;
  _Base_ptr p_Var18;
  uint uVar19;
  ulong uVar20;
  pointer pVVar21;
  Shader *pSVar22;
  int iVar23;
  VarType *complexType;
  long lVar24;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> bufferSizes;
  undefined1 local_f4 [16];
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  Shader *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  Program *local_80;
  long local_78;
  int local_70;
  int local_6c;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  InstanceCounter local_38;
  
  iVar6 = -1;
  __return_storage_ptr__->uniformBufferMaxBinding = -1;
  __return_storage_ptr__->uniformBufferMaxSize = 0;
  __return_storage_ptr__->numUniformBlocks = 0;
  __return_storage_ptr__->numCombinedVertexUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedGeometryUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessControlUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessEvalUniformComponents = 0;
  __return_storage_ptr__->shaderStorageBufferMaxBinding = -1;
  __return_storage_ptr__->shaderStorageBufferMaxSize = 0;
  __return_storage_ptr__->numShaderStorageBlocks = 0;
  __return_storage_ptr__->numVaryingComponents = 0;
  __return_storage_ptr__->numVaryingVectors = 0;
  __return_storage_ptr__->numCombinedSamplers = 0;
  __return_storage_ptr__->atomicCounterBufferMaxBinding = -1;
  __return_storage_ptr__->atomicCounterBufferMaxSize = 0;
  __return_storage_ptr__->numAtomicCounterBuffers = 0;
  __return_storage_ptr__->numAtomicCounters = 0;
  __return_storage_ptr__->maxImageBinding = -1;
  __return_storage_ptr__->numCombinedImages = 0;
  __return_storage_ptr__->numCombinedOutputResources = 0;
  __return_storage_ptr__->numXFBInterleavedComponents = 0;
  __return_storage_ptr__->numXFBSeparateAttribs = 0;
  __return_storage_ptr__->numXFBSeparateComponents = 0;
  __return_storage_ptr__->fragmentOutputMaxBinding = -1;
  iVar8 = __return_storage_ptr__->uniformBufferMaxSize;
  local_8c = __return_storage_ptr__->numUniformBlocks;
  local_9c = __return_storage_ptr__->numCombinedTessEvalUniformComponents;
  local_a0 = __return_storage_ptr__->numCombinedGeometryUniformComponents;
  local_a4 = __return_storage_ptr__->numCombinedTessControlUniformComponents;
  local_a8 = __return_storage_ptr__->numCombinedFragmentUniformComponents;
  local_ac = __return_storage_ptr__->numCombinedVertexUniformComponents;
  local_bc = __return_storage_ptr__->shaderStorageBufferMaxSize;
  local_84 = __return_storage_ptr__->numShaderStorageBlocks;
  local_88 = 0;
  iVar5 = __return_storage_ptr__->numCombinedImages;
  iVar9 = __return_storage_ptr__->numCombinedOutputResources;
  local_f4._4_8_ = __return_storage_ptr__;
  pvVar11 = ProgramInterfaceDefinition::Program::getShaders(program);
  if ((int)((ulong)((long)(pvVar11->
                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar11->
                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    local_e0 = 0;
    local_dc = 0;
    local_d8 = 0;
    local_e4 = 0;
  }
  else {
    lVar17 = 0;
    local_e4 = 0;
    local_d8 = 0;
    local_dc = 0;
    local_e0 = 0;
    local_c0 = -1;
    local_90 = -1;
    local_c4 = 0;
    local_c8 = 0;
    local_94 = 0;
    local_98 = -1;
    local_d4 = -1;
    local_80 = program;
    do {
      iVar23 = local_8c;
      local_70 = iVar9;
      local_6c = iVar5;
      pvVar11 = ProgramInterfaceDefinition::Program::getShaders(program);
      pSVar1 = (pvVar11->
               super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar17];
      local_78 = lVar17;
      iVar5 = anon_unknown_3::getMaxBufferBinding(pSVar1,STORAGE_UNIFORM);
      uVar3 = local_f4._4_8_;
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      *(int *)local_f4._4_8_ = iVar5;
      local_d0 = anon_unknown_3::getBufferMaxSize(pSVar1,STORAGE_UNIFORM);
      if (local_d0 < iVar8) {
        local_d0 = iVar8;
      }
      *(int *)(uVar3 + 4) = local_d0;
      iVar6 = anon_unknown_3::getNumShaderBlocks(pSVar1,STORAGE_UNIFORM);
      iVar9 = local_bc;
      iVar8 = local_c0;
      *(int *)(uVar3 + 8) = iVar6 + iVar23;
      switch(pSVar1->m_shaderType) {
      case SHADERTYPE_VERTEX:
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_ac = local_ac + iVar7;
        *(int *)(uVar3 + 0xc) = local_ac;
        break;
      case SHADERTYPE_FRAGMENT:
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_a8 = local_a8 + iVar7;
        *(int *)(uVar3 + 0x10) = local_a8;
        break;
      case SHADERTYPE_GEOMETRY:
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_a0 = local_a0 + iVar7;
        *(int *)(uVar3 + 0x14) = local_a0;
        break;
      case SHADERTYPE_TESSELLATION_CONTROL:
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_a4 = local_a4 + iVar7;
        *(int *)(uVar3 + 0x18) = local_a4;
        break;
      case SHADERTYPE_TESSELLATION_EVALUATION:
        iVar7 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
        local_9c = local_9c + iVar7;
        *(int *)(uVar3 + 0x1c) = local_9c;
      }
      iVar7 = anon_unknown_3::getMaxBufferBinding(pSVar1,STORAGE_BUFFER);
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      *(int *)(uVar3 + 0x20) = iVar8;
      iVar7 = anon_unknown_3::getBufferMaxSize(pSVar1,STORAGE_BUFFER);
      if (iVar9 <= iVar7) {
        iVar9 = iVar7;
      }
      *(int *)(uVar3 + 0x24) = iVar9;
      iVar7 = anon_unknown_3::getNumShaderBlocks(pSVar1,STORAGE_BUFFER);
      local_84 = local_84 + iVar7;
      *(int *)(uVar3 + 0x28) = local_84;
      local_cc = iVar5;
      local_c0 = iVar8;
      if (pSVar1->m_shaderType == SHADERTYPE_FRAGMENT) {
        iVar8 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_IN,anon_unknown_3::getNumDataTypeComponents);
        local_e0 = local_e0 + iVar8;
        iVar8 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_IN,anon_unknown_3::getNumDataTypeVectors);
        local_d8 = local_d8 + iVar8;
      }
      else if (pSVar1->m_shaderType == SHADERTYPE_VERTEX) {
        iVar8 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_OUT,anon_unknown_3::getNumDataTypeComponents);
        local_e4 = local_e4 + iVar8;
        iVar8 = anon_unknown_3::accumulateShaderStorage
                          (pSVar1,STORAGE_OUT,anon_unknown_3::getNumDataTypeVectors);
        local_dc = local_dc + iVar8;
      }
      pSVar22 = (Shader *)0x3;
      iVar8 = anon_unknown_3::getNumTypeInstances(pSVar1,STORAGE_UNIFORM,glu::isDataTypeSampler);
      local_88 = local_88 + iVar8;
      *(int *)(uVar3 + 0x34) = local_88;
      pVVar21 = (pSVar1->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = (int)((long)(pSVar1->m_defaultBlock).variables.
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar21 >> 5) *
               -0x55555555;
      local_b8 = pSVar1;
      if ((int)uVar19 < 1) {
        iVar8 = -1;
      }
      else {
        uVar20 = (ulong)(uVar19 & 0x7fffffff);
        complexType = &pVVar21->varType;
        iVar8 = -1;
        do {
          bVar4 = anon_unknown_3::containsSubType(complexType,(DataType)pSVar22);
          if ((bVar4) && (iVar5 = *(int *)((long)&complexType[-2].m_data + 0xc), iVar8 <= iVar5)) {
            iVar8 = iVar5;
          }
          complexType = complexType + 4;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      if (local_90 <= iVar8) {
        local_90 = iVar8;
      }
      *(int *)(uVar3 + 0x38) = local_90;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_68 + 8);
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      pVVar21 = (local_b8->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_bc = iVar9;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)((ulong)((long)(local_b8->m_defaultBlock).variables.
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar21) >> 5)
              * -0x55555555) {
        lVar17 = 0;
        do {
          bVar4 = anon_unknown_3::containsSubType(&pVVar21[lVar17].varType,(DataType)pSVar22);
          if (bVar4) {
            local_f4._0_4_ = pVVar21[lVar17].layout.binding;
            iVar8 = pVVar21[lVar17].layout.offset;
            local_38.m_predicate = glu::isDataTypeAtomicCounter;
            iVar5 = anon_unknown_3::
                    accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                              (&pVVar21[lVar17].varType,&local_38);
            if (iVar8 == -1) {
              iVar8 = 0;
            }
            p_Var2 = (_Base_ptr)((long)&local_68 + 8);
            p_Var16 = p_Var2;
            for (p_Var18 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var18 != (_Base_ptr)0x0;
                p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < (int)local_f4._0_4_]) {
              if ((int)local_f4._0_4_ <= (int)p_Var18[1]._M_color) {
                p_Var16 = p_Var18;
              }
            }
            p_Var18 = p_Var2;
            if ((p_Var16 != p_Var2) &&
               (p_Var18 = p_Var16, (int)local_f4._0_4_ < (int)p_Var16[1]._M_color)) {
              p_Var18 = p_Var2;
            }
            iVar8 = iVar8 + iVar5 * 4;
            if (p_Var18 == p_Var2) {
              pSVar22 = (Shader *)local_f4;
              piVar13 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type_conflict *)pSVar22);
            }
            else {
              pmVar12 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type_conflict *)local_f4);
              iVar5 = *pmVar12;
              pSVar22 = (Shader *)local_f4;
              piVar13 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_68,(key_type_conflict *)pSVar22);
              if (iVar8 < iVar5) {
                iVar8 = iVar5;
              }
            }
            *piVar13 = iVar8;
          }
          lVar17 = lVar17 + 1;
          pVVar21 = (local_b8->m_defaultBlock).variables.
                    super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar17 < (int)((ulong)((long)(local_b8->m_defaultBlock).variables.
                                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pVVar21) >> 5) * -0x55555555);
      }
      iVar9 = local_c4;
      iVar5 = local_c8;
      uVar3 = local_f4._4_8_;
      iVar8 = 0;
      for (p_Var14 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var14 != (_Rb_tree_node_base *)((long)&local_68 + 8U);
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        if (iVar8 <= *(int *)&p_Var14[1].field_0x4) {
          iVar8 = *(int *)&p_Var14[1].field_0x4;
        }
      }
      local_8c = iVar6 + iVar23;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_68);
      pSVar1 = local_b8;
      local_c4 = iVar9;
      if (iVar9 <= iVar8) {
        local_c4 = iVar8;
      }
      *(int *)(uVar3 + 0x3c) = local_c4;
      local_c8 = anon_unknown_3::getNumAtomicCounterBuffers((anon_unknown_3 *)local_b8,pSVar22);
      local_c8 = iVar5 + local_c8;
      *(int *)(uVar3 + 0x40) = local_c8;
      iVar8 = anon_unknown_3::getNumTypeInstances
                        (pSVar1,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
      pSVar22 = local_b8;
      local_94 = local_94 + iVar8;
      *(int *)(uVar3 + 0x44) = local_94;
      pVVar21 = (pSVar1->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar8 = -1;
      if (0 < (int)((ulong)((long)(pSVar1->m_defaultBlock).variables.
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar21) >> 5)
              * -0x55555555) {
        lVar24 = 0x20;
        lVar17 = 0;
        do {
          iVar9 = *(int *)((long)pVVar21 + lVar24 + -0x1c);
          iVar5 = iVar9 + -1;
          local_68._M_impl._0_8_ = glu::isDataTypeImage;
          iVar6 = anon_unknown_3::
                  accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                            ((VarType *)((long)&(pVVar21->layout).location + lVar24),
                             (InstanceCounter *)&local_68);
          if (iVar9 == -1) {
            iVar5 = -1;
          }
          if (iVar8 <= iVar5 + iVar6) {
            iVar8 = iVar5 + iVar6;
          }
          lVar17 = lVar17 + 1;
          pVVar21 = (pSVar22->m_defaultBlock).variables.
                    super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = lVar24 + 0x60;
        } while (lVar17 < (int)((ulong)((long)(pSVar22->m_defaultBlock).variables.
                                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pVVar21) >> 5) * -0x55555555);
      }
      uVar3 = local_f4._4_8_;
      if (local_98 <= iVar8) {
        local_98 = iVar8;
      }
      *(int *)(local_f4._4_8_ + 0x48) = local_98;
      iVar5 = anon_unknown_3::getNumTypeInstances(pSVar22,STORAGE_UNIFORM,glu::isDataTypeImage);
      iVar5 = local_6c + iVar5;
      *(int *)(uVar3 + 0x4c) = iVar5;
      iVar8 = anon_unknown_3::getNumTypeInstances(pSVar22,STORAGE_UNIFORM,glu::isDataTypeImage);
      iVar8 = local_70 + iVar8;
      *(int *)(uVar3 + 0x50) = iVar8;
      iVar9 = anon_unknown_3::getNumShaderBlocks(pSVar22,STORAGE_BUFFER);
      iVar9 = iVar9 + iVar8;
      *(int *)(uVar3 + 0x50) = iVar9;
      if (pSVar22->m_shaderType == SHADERTYPE_FRAGMENT) {
        iVar8 = anon_unknown_3::accumulateShaderStorage
                          (pSVar22,STORAGE_OUT,anon_unknown_3::getNumDataTypeVectors);
        iVar9 = iVar8 + iVar9;
        *(int *)(uVar3 + 0x50) = iVar9;
        pVVar21 = (pSVar22->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = (int)((long)(pSVar22->m_defaultBlock).variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar21 >> 5) *
                 -0x55555555;
        if ((int)uVar19 < 1) {
          iVar8 = -1;
        }
        else {
          uVar20 = (ulong)(uVar19 & 0x7fffffff);
          piVar13 = (int *)((long)&(pVVar21->varType).m_data + 8);
          iVar8 = -1;
          do {
            if (piVar13[-6] == 1) {
              iVar6 = 1;
              if (piVar13[-4] == 1) {
                iVar6 = *piVar13;
              }
              iVar23 = piVar13[-0xc] + -1;
              if (piVar13[-0xc] == -1) {
                iVar23 = -1;
              }
              if (iVar8 <= iVar23 + iVar6) {
                iVar8 = iVar23 + iVar6;
              }
            }
            piVar13 = piVar13 + 0x18;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        if (local_d4 <= iVar8) {
          local_d4 = iVar8;
        }
        *(int *)(local_f4._4_8_ + 0x60) = local_d4;
      }
      program = local_80;
      iVar6 = local_cc;
      iVar8 = local_d0;
      lVar17 = local_78 + 1;
      pvVar11 = ProgramInterfaceDefinition::Program::getShaders(local_80);
    } while (lVar17 < (int)((ulong)((long)(pvVar11->
                                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar11->
                                         super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  dVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
  if (dVar10 == 0x8c8c) {
    pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_(program);
    if ((int)((ulong)((long)(pvVar15->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar15->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      iVar8 = 0;
    }
    else {
      lVar17 = 0;
      lVar24 = 0;
      iVar8 = 0;
      do {
        pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program);
        iVar5 = anon_unknown_3::getNumFeedbackVaryingComponents
                          (program,(string *)
                                   ((long)&(((pvVar15->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar17));
        iVar8 = iVar8 + iVar5;
        lVar24 = lVar24 + 1;
        pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program);
        lVar17 = lVar17 + 0x20;
      } while (lVar24 < (int)((ulong)((long)(pvVar15->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pvVar15->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    *(int *)(local_f4._4_8_ + 0x54) = iVar8;
  }
  else {
    dVar10 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
    uVar3 = local_f4._4_8_;
    if (dVar10 == 0x8c8d) {
      pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      *(int *)(uVar3 + 0x58) =
           (int)((ulong)((long)(pvVar15->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar15->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
      pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      if ((int)((ulong)((long)(pvVar15->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar15->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
        iVar8 = 0;
      }
      else {
        lVar17 = 0;
        lVar24 = 0;
        iVar8 = 0;
        do {
          pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                              (program);
          iVar5 = anon_unknown_3::getNumFeedbackVaryingComponents
                            (program,(string *)
                                     ((long)&(((pvVar15->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar17));
          if (iVar8 <= iVar5) {
            iVar8 = iVar5;
          }
          lVar24 = lVar24 + 1;
          pvVar15 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                              (program);
          lVar17 = lVar17 + 0x20;
        } while (lVar24 < (int)((ulong)((long)(pvVar15->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar15->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 5));
      }
      *(int *)(local_f4._4_8_ + 0x5c) = iVar8;
    }
  }
  if (local_e0 < local_e4) {
    local_e0 = local_e4;
  }
  ((ProgramResourceUsage *)local_f4._4_8_)->numVaryingComponents = local_e0;
  if (local_d8 < local_dc) {
    local_d8 = local_dc;
  }
  ((ProgramResourceUsage *)local_f4._4_8_)->numVaryingVectors = local_d8;
  return (ProgramResourceUsage *)local_f4._4_8_;
}

Assistant:

ProgramInterfaceDefinition::ProgramResourceUsage getCombinedProgramResourceUsage (const ProgramInterfaceDefinition::Program* program)
{
	ProgramInterfaceDefinition::ProgramResourceUsage	retVal;
	int													numVertexOutputComponents	= 0;
	int													numFragmentInputComponents	= 0;
	int													numVertexOutputVectors		= 0;
	int													numFragmentInputVectors		= 0;

	retVal.uniformBufferMaxBinding					= -1; // max binding is inclusive upper bound. Allow 0 bindings by using negative value
	retVal.uniformBufferMaxSize						= 0;
	retVal.numUniformBlocks							= 0;
	retVal.numCombinedVertexUniformComponents		= 0;
	retVal.numCombinedFragmentUniformComponents		= 0;
	retVal.numCombinedGeometryUniformComponents		= 0;
	retVal.numCombinedTessControlUniformComponents	= 0;
	retVal.numCombinedTessEvalUniformComponents		= 0;
	retVal.shaderStorageBufferMaxBinding			= -1; // see above
	retVal.shaderStorageBufferMaxSize				= 0;
	retVal.numShaderStorageBlocks					= 0;
	retVal.numVaryingComponents						= 0;
	retVal.numVaryingVectors						= 0;
	retVal.numCombinedSamplers						= 0;
	retVal.atomicCounterBufferMaxBinding			= -1; // see above
	retVal.atomicCounterBufferMaxSize				= 0;
	retVal.numAtomicCounterBuffers					= 0;
	retVal.numAtomicCounters						= 0;
	retVal.maxImageBinding							= -1; // see above
	retVal.numCombinedImages						= 0;
	retVal.numCombinedOutputResources				= 0;
	retVal.numXFBInterleavedComponents				= 0;
	retVal.numXFBSeparateAttribs					= 0;
	retVal.numXFBSeparateComponents					= 0;
	retVal.fragmentOutputMaxBinding					= -1; // see above

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];

		retVal.uniformBufferMaxBinding		= de::max(retVal.uniformBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_UNIFORM));
		retVal.uniformBufferMaxSize			= de::max(retVal.uniformBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_UNIFORM));
		retVal.numUniformBlocks				+= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);

		switch (shader->getType())
		{
			case glu::SHADERTYPE_VERTEX:					retVal.numCombinedVertexUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_FRAGMENT:					retVal.numCombinedFragmentUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_GEOMETRY:					retVal.numCombinedGeometryUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_CONTROL:		retVal.numCombinedTessControlUniformComponents	+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_EVALUATION:	retVal.numCombinedTessEvalUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			default: break;
		}

		retVal.shaderStorageBufferMaxBinding	= de::max(retVal.shaderStorageBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_BUFFER));
		retVal.shaderStorageBufferMaxSize		= de::max(retVal.shaderStorageBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_BUFFER));
		retVal.numShaderStorageBlocks			+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_VERTEX)
		{
			numVertexOutputComponents	+= getNumComponents(shader, glu::STORAGE_OUT);
			numVertexOutputVectors		+= getNumVectors(shader, glu::STORAGE_OUT);
		}
		else if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			numFragmentInputComponents	+= getNumComponents(shader, glu::STORAGE_IN);
			numFragmentInputVectors		+= getNumVectors(shader, glu::STORAGE_IN);
		}

		retVal.numCombinedSamplers	+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);

		retVal.atomicCounterBufferMaxBinding	= de::max(retVal.atomicCounterBufferMaxBinding, getAtomicCounterMaxBinding(shader));
		retVal.atomicCounterBufferMaxSize		= de::max(retVal.atomicCounterBufferMaxSize, getAtomicCounterMaxBufferSize(shader));
		retVal.numAtomicCounterBuffers			+= getNumAtomicCounterBuffers(shader);
		retVal.numAtomicCounters				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);
		retVal.maxImageBinding					= de::max(retVal.maxImageBinding, getUniformMaxBinding(shader, glu::isDataTypeImage));
		retVal.numCombinedImages				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

		retVal.numCombinedOutputResources		+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);
		retVal.numCombinedOutputResources		+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			retVal.numCombinedOutputResources += getNumVectors(shader, glu::STORAGE_OUT);
			retVal.fragmentOutputMaxBinding = de::max(retVal.fragmentOutputMaxBinding, getFragmentOutputMaxLocation(shader));
		}
	}

	if (program->getTransformFeedbackMode() == GL_INTERLEAVED_ATTRIBS)
		retVal.numXFBInterleavedComponents = getNumXFBComponents(program);
	else if (program->getTransformFeedbackMode() == GL_SEPARATE_ATTRIBS)
	{
		retVal.numXFBSeparateAttribs	= (int)program->getTransformFeedbackVaryings().size();
		retVal.numXFBSeparateComponents	= getNumMaxXFBOutputComponents(program);
	}

	// legacy limits
	retVal.numVaryingComponents	= de::max(numVertexOutputComponents, numFragmentInputComponents);
	retVal.numVaryingVectors	= de::max(numVertexOutputVectors, numFragmentInputVectors);

	return retVal;
}